

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu.c
# Opt level: O3

RK_U32 VPUCheckSupportWidth(void)

{
  int socket;
  RK_S32 RVar1;
  RK_U32 RVar2;
  VPUHwDecConfig_t hwCfg;
  RK_U32 local_68 [22];
  
  RVar2 = 0;
  socket = open("/dev/vpu_service",0x80002);
  if ((-1 < socket) || (socket = open("/dev/vpu-service",0x80002), -1 < socket)) {
    local_68[0xf] = 0;
    local_68[0x11] = 0;
    local_68[0x12] = 0;
    local_68[0x10] = 0;
    local_68[0xe] = 0;
    local_68[0xc] = 0;
    local_68[0xd] = 0;
    local_68[10] = 0;
    local_68[0xb] = 0;
    local_68[8] = 0;
    local_68[9] = 0;
    local_68[6] = 0;
    local_68[7] = 0;
    local_68[4] = 0;
    local_68[5] = 0;
    local_68[2] = 0;
    local_68[3] = 0;
    local_68[0] = 0;
    local_68[1] = 0;
    RVar1 = VPUClientGetHwCfg(socket,local_68,0x4c);
    if (RVar1 == 0) {
      close(socket);
      RVar2 = local_68[0];
    }
    else {
      _mpp_log_l(2,"vpu","Get HwCfg failed\n","VPUCheckSupportWidth");
      close(socket);
      RVar2 = 0xffffffff;
    }
  }
  return RVar2;
}

Assistant:

RK_U32 VPUCheckSupportWidth()
{
    VPUHwDecConfig_t hwCfg;
    int fd = -1;
    fd = open("/dev/vpu_service", O_RDWR | O_CLOEXEC);
    if (fd < 0) {
        fd = open("/dev/vpu-service", O_RDWR | O_CLOEXEC);
    }
    memset(&hwCfg, 0, sizeof(VPUHwDecConfig_t));
    if (fd >= 0) {
        if (VPUClientGetHwCfg(fd, (RK_U32*)&hwCfg, sizeof(hwCfg))) {
            mpp_err_f("Get HwCfg failed\n");
            close(fd);
            return -1;
        }
        close(fd);
        fd = -1;
    }
    return hwCfg.maxDecPicWidth;
}